

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Args::Args(Args *this,int argc,char **argv)

{
  bool bVar1;
  Argument *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  string_view aArgumentName_03;
  string_view aArgumentName_04;
  string_view aArgumentName_05;
  string_view aArgumentName_06;
  string_view aArgumentName_07;
  string_view aArgumentName_08;
  allocator<char> local_379;
  path local_378;
  int local_34c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  char **local_310;
  any local_308;
  any local_2f8;
  any local_2e8;
  ArgumentParser program;
  path local_258;
  path local_230;
  string local_208;
  any local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  path local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  any local_f0;
  any local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  any local_b0;
  any local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  any local_70;
  any local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->keep_hashed = false;
  this->recursive = false;
  this->log = false;
  (this->dir)._M_dataplus._M_p = (pointer)&(this->dir).field_2;
  (this->dir)._M_string_length = 0;
  (this->dir).field_2._M_local_buf[0] = '\0';
  (this->input_file)._M_dataplus._M_p = (pointer)&(this->input_file).field_2;
  (this->input_file)._M_string_length = 0;
  (this->input_file).field_2._M_local_buf[0] = '\0';
  (this->output_file)._M_dataplus._M_p = (pointer)&(this->output_file).field_2;
  (this->output_file)._M_string_length = 0;
  (this->output_file).field_2._M_local_buf[0] = '\0';
  (this->input_dir)._M_dataplus._M_p = (pointer)&(this->input_dir).field_2;
  (this->input_dir)._M_string_length = 0;
  local_318 = &this->dir;
  local_330 = &this->input_file;
  (this->input_dir).field_2._M_local_buf[0] = '\0';
  (this->output_dir)._M_dataplus._M_p = (pointer)&(this->output_dir).field_2;
  (this->output_dir)._M_string_length = 0;
  local_340 = &this->output_file;
  local_338 = &this->input_dir;
  (this->output_dir).field_2._M_local_buf[0] = '\0';
  (this->input_format)._M_dataplus._M_p = (pointer)&(this->input_format).field_2;
  (this->input_format)._M_string_length = 0;
  local_348 = &this->output_dir;
  local_320 = &this->input_format;
  (this->input_format).field_2._M_local_buf[0] = '\0';
  (this->output_format)._M_dataplus._M_p = (pointer)&(this->output_format).field_2;
  (this->output_format)._M_string_length = 0;
  local_328 = &this->output_format;
  (this->output_format).field_2._M_local_buf[0] = '\0';
  (this->unhasher).
  super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->unhasher).
  super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_310 = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"ritobin",(allocator<char> *)&local_378);
  local_34c = argc;
  argparse::ArgumentParser::ArgumentParser(&program,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&program,"-k","--keep-hashed");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"do not run unhasher",(allocator<char> *)&local_378);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_50);
  local_60._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_60._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar2->mDefaultValue,&local_60);
  local_70._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_70._M_storage = (_Storage)0x1;
  argparse::Argument::implicit_value(pAVar2,&local_70);
  std::any::reset(&local_70);
  std::any::reset(&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&program,"-r","--recursive");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"run on directory",(allocator<char> *)&local_378);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_90);
  local_a0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_a0._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar2->mDefaultValue,&local_a0);
  local_b0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_b0._M_storage = (_Storage)0x1;
  argparse::Argument::implicit_value(pAVar2,&local_b0);
  std::any::reset(&local_b0);
  std::any::reset(&local_a0);
  std::__cxx11::string::~string((string *)&local_90);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&program,"-v","--verbose");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"log more",(allocator<char> *)&local_378);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_d0);
  local_e0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_e0._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar2->mDefaultValue,&local_e0);
  local_f0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_f0._M_storage = (_Storage)0x1;
  argparse::Argument::implicit_value(pAVar2,&local_f0);
  std::any::reset(&local_f0);
  std::any::reset(&local_e0);
  std::__cxx11::string::~string((string *)&local_d0);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&program,"input");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"input file or directory",(allocator<char> *)&local_378);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_110);
  pAVar2->field_0xbc = pAVar2->field_0xbc | 2;
  std::__cxx11::string::~string((string *)&local_110);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&program,"output");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"output file or directory",(allocator<char> *)&local_230);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"",(allocator<char> *)&local_258);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_1e8,&local_378._M_pathname);
  std::any::operator=(&pAVar2->mDefaultValue,&local_1e8);
  std::any::reset(&local_1e8);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_1d8);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&program,"-i","--input-format");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"",(allocator<char> *)&local_230);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_2e8,&local_378._M_pathname);
  std::any::operator=(&pAVar2->mDefaultValue,&local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"format of input file",(allocator<char> *)&local_258);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::any::reset(&local_2e8);
  std::__cxx11::string::~string((string *)&local_378);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&program,"-o","--output-format");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"",(allocator<char> *)&local_230);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_2f8,&local_378._M_pathname);
  std::any::operator=(&pAVar2->mDefaultValue,&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"format of output file",(allocator<char> *)&local_258);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::any::reset(&local_2f8);
  std::__cxx11::string::~string((string *)&local_378);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     (&program,"-d","--dir-hashes");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_258,local_310,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_198,(char (*) [7])0x131158,auto_format);
  std::filesystem::__cxx11::operator/(&local_378,&local_230,&local_198);
  std::filesystem::__cxx11::path::generic_string(&local_208,&local_378);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_308,&local_208);
  std::any::operator=(&pAVar2->mDefaultValue,&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"directory containing hashes",&local_379);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar2->mHelp,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::any::reset(&local_308);
  std::__cxx11::string::~string((string *)&local_208);
  std::filesystem::__cxx11::path::~path(&local_378);
  std::filesystem::__cxx11::path::~path(&local_198);
  std::filesystem::__cxx11::path::~path(&local_230);
  std::filesystem::__cxx11::path::~path(&local_258);
  argparse::ArgumentParser::parse_args(&program,local_34c,local_310);
  aArgumentName._M_str = "--dir-hashes";
  aArgumentName._M_len = 0xc;
  argparse::ArgumentParser::get<std::__cxx11::string>(&local_378._M_pathname,&program,aArgumentName)
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_318,&local_378._M_pathname);
  std::__cxx11::string::~string((string *)&local_378);
  aArgumentName_06._M_str = "--keep-hashed";
  aArgumentName_06._M_len = 0xd;
  bVar1 = argparse::ArgumentParser::get<bool>(&program,aArgumentName_06);
  this->keep_hashed = bVar1;
  aArgumentName_07._M_str = "--recursive";
  aArgumentName_07._M_len = 0xb;
  bVar1 = argparse::ArgumentParser::get<bool>(&program,aArgumentName_07);
  this->recursive = bVar1;
  aArgumentName_08._M_str = "--verbose";
  aArgumentName_08._M_len = 9;
  bVar1 = argparse::ArgumentParser::get<bool>(&program,aArgumentName_08);
  this->log = bVar1;
  aArgumentName_00._M_str = "--input-format";
  aArgumentName_00._M_len = 0xe;
  argparse::ArgumentParser::get<std::__cxx11::string>
            (&local_378._M_pathname,&program,aArgumentName_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_320,&local_378._M_pathname);
  std::__cxx11::string::~string((string *)&local_378);
  aArgumentName_01._M_str = "--output-format";
  aArgumentName_01._M_len = 0xf;
  argparse::ArgumentParser::get<std::__cxx11::string>
            (&local_378._M_pathname,&program,aArgumentName_01);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_328,&local_378._M_pathname);
  std::__cxx11::string::~string((string *)&local_378);
  if (this->recursive == true) {
    aArgumentName_02._M_str = "input";
    aArgumentName_02._M_len = 5;
    argparse::ArgumentParser::get<std::__cxx11::string>
              (&local_378._M_pathname,&program,aArgumentName_02);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_338,&local_378._M_pathname);
    std::__cxx11::string::~string((string *)&local_378);
    aArgumentName_03._M_str = "output";
    aArgumentName_03._M_len = 6;
    argparse::ArgumentParser::get<std::__cxx11::string>
              (&local_378._M_pathname,&program,aArgumentName_03);
    this_00 = local_348;
  }
  else {
    aArgumentName_04._M_str = "input";
    aArgumentName_04._M_len = 5;
    argparse::ArgumentParser::get<std::__cxx11::string>
              (&local_378._M_pathname,&program,aArgumentName_04);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_330,&local_378._M_pathname);
    std::__cxx11::string::~string((string *)&local_378);
    aArgumentName_05._M_str = "output";
    aArgumentName_05._M_len = 6;
    argparse::ArgumentParser::get<std::__cxx11::string>
              (&local_378._M_pathname,&program,aArgumentName_05);
    this_00 = local_340;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,&local_378._M_pathname);
  std::__cxx11::string::~string((string *)&local_378);
  std::make_shared<std::optional<ritobin::BinUnhasher>,std::nullopt_t_const&>
            ((nullopt_t *)&local_378);
  std::__shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->unhasher).
              super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2> *)
             &local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_378._M_pathname._M_string_length);
  argparse::ArgumentParser::~ArgumentParser(&program);
  return;
}

Assistant:

Args(int argc, char** argv) {
        argparse::ArgumentParser program("ritobin");
        program.add_argument("-k", "--keep-hashed")
                .help("do not run unhasher")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("-r", "--recursive")
                .help("run on directory")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("-v", "--verbose")
                .help("log more")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("input")
                .help("input file or directory")
                .required();
        program.add_argument("output")
                .help("output file or directory")
                .default_value(std::string(""));
        program.add_argument("-i", "--input-format")
                .default_value(std::string(""))
                .help("format of input file");
        program.add_argument("-o", "--output-format")
                .default_value(std::string(""))
                .help("format of output file");
        program.add_argument("-d", "--dir-hashes")
                .default_value((fs::path(argv[0]).parent_path() / "hashes").generic_string())
                .help("directory containing hashes");
        try {
            program.parse_args(argc, argv);
            dir =  program.get<std::string>("--dir-hashes");
            keep_hashed = program.get<bool>("--keep-hashed");
            recursive = program.get<bool>("--recursive");
            log = program.get<bool>("--verbose");
            input_format = program.get<std::string>("--input-format");
            output_format = program.get<std::string>("--output-format");
            if (recursive) {
                input_dir = program.get<std::string>("input");
                output_dir = program.get<std::string>("output");
            } else {
                input_file = program.get<std::string>("input");
                output_file = program.get<std::string>("output");
            }
        } catch (const std::runtime_error& err) {
            std::cerr << err.what() << std::endl;
            std::cerr << program << std::endl;
            std::cerr << "Formats:" << std::endl;
            for (auto format: ritobin::io::DynamicFormat::list()) {
                std::cerr << "\t- " << format->name() << std::endl;
            }
            exit(-1);
        }
        unhasher = std::make_shared<std::optional<BinUnhasher>>(std::nullopt);
    }